

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void Blowfish_expand0state(blf_ctx *c,uint8_t *key,uint16_t keybytes)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  uint32_t *puVar4;
  uint32_t datar;
  uint32_t datal;
  uint16_t local_32;
  
  local_32 = 0;
  for (lVar2 = 0x400; lVar2 != 0x412; lVar2 = lVar2 + 1) {
    uVar1 = Blowfish_stream2word(key,0x40,&local_32);
    puVar4 = c->S[0] + lVar2;
    *puVar4 = *puVar4 ^ uVar1;
  }
  datal = 0;
  datar = 0;
  for (uVar3 = 0; uVar3 < 0x12; uVar3 = uVar3 + 2) {
    Blowfish_encipher(c,&datal,&datar);
    c->P[uVar3] = datal;
    c->P[uVar3 + 1] = datar;
  }
  puVar4 = c->S[0] + 1;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < 0x100; uVar3 = uVar3 + 2) {
      Blowfish_encipher(c,&datal,&datar);
      puVar4[uVar3 - 1] = datal;
      puVar4[uVar3] = datar;
    }
    puVar4 = puVar4 + 0x100;
  }
  return;
}

Assistant:

static void
Blowfish_expand0state(blf_ctx *c, const uint8_t *key, uint16_t keybytes)
{
    int i;
    int k;
    uint16_t j;
    uint32_t temp;
    uint32_t datal;
    uint32_t datar;

    j = 0;
    for(i = 0; i < BLF_N + 2; i++) {
        /* Extract 4 int8 to 1 int32 from keystream */
        temp = Blowfish_stream2word(key, keybytes, &j);
        c->P[i] = c->P[i] ^ temp;
    }

    j = 0;
    datal = 0x00000000;
    datar = 0x00000000;
    for(i = 0; i < BLF_N + 2; i += 2) {
        Blowfish_encipher(c, &datal, &datar);

        c->P[i] = datal;
        c->P[i + 1] = datar;
    }

    for(i = 0; i < 4; i++) {
        for(k = 0; k < 256; k += 2) {
            Blowfish_encipher(c, &datal, &datar);

            c->S[i][k] = datal;
            c->S[i][k + 1] = datar;
        }
    }
}